

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O2

size_t __thiscall
cali::CompressedSnapshotRecord::append(CompressedSnapshotRecord *this,size_t n,Node **node_vec)

{
  size_t sVar1;
  size_t __n;
  size_t __n_00;
  uchar *puVar2;
  size_t sVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  size_t sVar6;
  uchar tmp [40];
  
  sVar3 = 0;
  do {
    if (n == 0) {
      this->m_skipped = this->m_skipped + sVar3;
      return sVar3;
    }
    uVar4 = 4;
    if (n < 4) {
      uVar4 = n;
    }
    __n_00 = 0;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      sVar1 = vlenc_u64(node_vec[uVar5]->m_id,tmp + __n_00);
      __n_00 = __n_00 + sVar1;
    }
    if (this->m_num_nodes + uVar4 < 0x80) {
      sVar1 = this->m_imm_pos;
      sVar6 = this->m_imm_len;
      if (this->m_buffer_len < sVar1 + __n_00 + sVar6) goto LAB_001b7440;
      puVar2 = this->m_buffer;
      if (sVar6 != 0 && __n_00 != 0) {
        do {
          __n = 0x40;
          if (sVar6 < 0x40) {
            __n = sVar6;
          }
          sVar6 = sVar6 - __n;
          memmove(puVar2 + sVar6 + __n_00 + sVar1,puVar2 + sVar6 + sVar1,__n);
        } while (sVar6 != 0);
        puVar2 = this->m_buffer;
      }
      memcpy(puVar2 + 1,tmp,__n_00);
      this->m_imm_pos = this->m_imm_pos + __n_00;
      this->m_num_nodes = this->m_num_nodes + uVar4;
      *this->m_buffer = *this->m_buffer + (char)uVar4;
    }
    else {
LAB_001b7440:
      sVar3 = sVar3 + uVar4;
    }
    this->m_needed_len = this->m_needed_len + __n_00;
    node_vec = node_vec + uVar4;
    n = n - uVar4;
  } while( true );
}

Assistant:

size_t CompressedSnapshotRecord::append(size_t n, const Node* const node_vec[])
{
    size_t skipped = 0;

    // blockwise encode, size check, and copy
    while (n > 0) {
        unsigned char tmp[m_blocksize * 10];
        size_t        blk = std::min(n, m_blocksize);
        size_t        len = 0;

        // encode to temp buffer
        for (size_t i = 0; i < blk; ++i)
            len += vlenc_u64(node_vec[i]->id(), tmp + len);

        // size check, copy to actual buffer
        if (m_num_nodes + blk < 128 && m_imm_pos + m_imm_len + len <= m_buffer_len) {
            ::save_memmove(m_buffer + m_imm_pos + len, m_buffer + m_imm_pos, m_imm_len);
            memcpy(m_buffer + 1, tmp, len);

            m_imm_pos += len;
            m_num_nodes += blk;
            m_buffer[0] += blk;
        } else {
            skipped += blk;
        }

        m_needed_len += len;

        // advance
        node_vec += blk;
        n -= blk;
    }

    m_skipped += skipped;

    return skipped;
}